

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cpp
# Opt level: O2

void writeBPMatrix(Manager *manager,int puzNum,int rowNum,int colNum)

{
  ulong uVar1;
  ostream *poVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  ostream local_258 [8];
  ofstream file;
  
  std::ofstream::ofstream(local_258,"bpgMatrix.txt",_S_out);
  uVar6 = 0;
  if (0 < colNum) {
    uVar6 = (ulong)(uint)colNum;
  }
  uVar1 = 0;
  if (0 < rowNum) {
    uVar1 = (ulong)(uint)rowNum;
  }
  for (uVar5 = 0;
      uVar5 < (ulong)(((long)(manager->puzzles).super__Vector_base<Board,_std::allocator<Board>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                      (long)(manager->puzzles).super__Vector_base<Board,_std::allocator<Board>_>.
                            _M_impl.super__Vector_impl_data._M_start) / 0x38); uVar5 = uVar5 + 1) {
    poVar2 = (ostream *)std::ostream::operator<<(local_258,puzNum);
    std::endl<char,std::char_traits<char>>(poVar2);
    poVar2 = (ostream *)std::ostream::operator<<(local_258,rowNum);
    poVar2 = std::operator<<(poVar2," ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,colNum);
    std::endl<char,std::char_traits<char>>(poVar2);
    for (uVar3 = 0; uVar3 != uVar1; uVar3 = uVar3 + 1) {
      for (lVar4 = 0; uVar6 * 0x20 != lVar4; lVar4 = lVar4 + 0x20) {
        poVar2 = std::operator<<(local_258,
                                 (string *)
                                 (*(long *)(*(long *)&(manager->puzzles).
                                                                                                            
                                                  super__Vector_base<Board,_std::allocator<Board>_>.
                                                  _M_impl.super__Vector_impl_data._M_start[uVar5].
                                                  matrix.
                                                  super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                           + uVar3 * 0x18) + lVar4));
        std::operator<<(poVar2,"  ");
      }
      std::operator<<(local_258,"\n");
    }
    std::operator<<(local_258,"\n\n\n");
  }
  std::ofstream::close();
  poVar2 = std::operator<<((ostream *)&std::cout,"File saved sucessfully! ;)");
  std::endl<char,std::char_traits<char>>(poVar2);
  std::ofstream::~ofstream(local_258);
  return;
}

Assistant:

void writeBPMatrix( Manager manager, int puzNum, int rowNum, int colNum )
{
	std::ofstream file("bpgMatrix.txt");
	
    for( int vec = 0; vec < manager.puzzles.size(); vec++ )
    {
	      file << puzNum << std::endl;

	      file << rowNum
		    << " "
		    << colNum
		    << std::endl;
        for ( int i = 0; i < rowNum; i++)
        {
		        for( int j = 0; j < colNum; j++ )
            {
                file << manager.puzzles[vec].matrix[i][j] << "  ";
            }

            file << "\n";
        }

        file << "\n\n\n";
    }

	file.close();

	std::cout << "File saved sucessfully! ;)" << std::endl;
}